

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso3.c
# Opt level: O0

uint Gia_Iso3Node(Gia_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj_local;
  
  iVar1 = Gia_ObjIsAnd(pObj);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCo(pObj);
      if (iVar1 == 0) {
        pObj_local._4_4_ = Iso_Nodes[5];
      }
      else {
        pObj_local._4_4_ = Iso_Nodes[4];
      }
    }
    else {
      pObj_local._4_4_ = Iso_Nodes[3];
    }
  }
  else {
    iVar1 = Gia_ObjFaninC0(pObj);
    iVar2 = Gia_ObjFaninC1(pObj);
    pObj_local._4_4_ = Iso_Nodes[iVar1 + iVar2];
  }
  return pObj_local._4_4_;
}

Assistant:

static inline unsigned Gia_Iso3Node( Gia_Obj_t * pObj )
{
    if ( Gia_ObjIsAnd(pObj) )
        return Iso_Nodes[Gia_ObjFaninC0(pObj) + Gia_ObjFaninC1(pObj)];
    if ( Gia_ObjIsCi(pObj) )
        return Iso_Nodes[3];
    if ( Gia_ObjIsCo(pObj) )
        return Iso_Nodes[4];
    return Iso_Nodes[5];
}